

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_commutativity(void)

{
  int iVar1;
  secp256k1_ge mid2;
  secp256k1_ge mid1;
  secp256k1_gej res2;
  secp256k1_gej res1;
  secp256k1_scalar b;
  secp256k1_scalar a;
  secp256k1_scalar *in_stack_00000a60;
  secp256k1_ge *in_stack_00000a68;
  secp256k1_gej *in_stack_00000a70;
  secp256k1_ge *in_stack_fffffffffffffe30;
  secp256k1_ge *in_stack_fffffffffffffe38;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_ge *in_stack_fffffffffffffe60;
  
  testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffe30);
  testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffffe30);
  secp256k1_ecmult_const(in_stack_00000a70,in_stack_00000a68,in_stack_00000a60);
  secp256k1_ecmult_const(in_stack_00000a70,in_stack_00000a68,in_stack_00000a60);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  secp256k1_ecmult_const(in_stack_00000a70,in_stack_00000a68,in_stack_00000a60);
  secp256k1_ecmult_const(in_stack_00000a70,in_stack_00000a68,in_stack_00000a60);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1167,"test condition failed: secp256k1_ge_eq_var(&mid1, &mid2)");
    abort();
  }
  return;
}

Assistant:

static void ecmult_const_commutativity(void) {
    secp256k1_scalar a;
    secp256k1_scalar b;
    secp256k1_gej res1;
    secp256k1_gej res2;
    secp256k1_ge mid1;
    secp256k1_ge mid2;
    testutil_random_scalar_order_test(&a);
    testutil_random_scalar_order_test(&b);

    secp256k1_ecmult_const(&res1, &secp256k1_ge_const_g, &a);
    secp256k1_ecmult_const(&res2, &secp256k1_ge_const_g, &b);
    secp256k1_ge_set_gej(&mid1, &res1);
    secp256k1_ge_set_gej(&mid2, &res2);
    secp256k1_ecmult_const(&res1, &mid1, &b);
    secp256k1_ecmult_const(&res2, &mid2, &a);
    secp256k1_ge_set_gej(&mid1, &res1);
    secp256k1_ge_set_gej(&mid2, &res2);
    CHECK(secp256k1_ge_eq_var(&mid1, &mid2));
}